

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

StringRef __thiscall llvm::sys::path::extension(path *this,StringRef path,Style style)

{
  StringRef LHS;
  StringRef LHS_00;
  StringRef path_00;
  bool bVar1;
  size_t sVar2;
  StringRef local_98;
  char *local_88;
  char *local_80;
  StringRef local_78;
  char *local_68;
  char *local_60;
  size_t local_58;
  size_t pos;
  char *local_48;
  undefined1 local_40 [8];
  StringRef fname;
  Style style_local;
  StringRef path_local;
  
  local_48 = path.Data;
  fname.Length._4_4_ = (Style)path.Length;
  path_00.Length = (size_t)local_48;
  path_00.Data = (char *)this;
  pos = (size_t)this;
  path_local.Data = local_48;
  _local_40 = filename(path_00,fname.Length._4_4_);
  local_58 = StringRef::find_last_of((StringRef *)local_40,'.',0xffffffffffffffff);
  if (local_58 == 0xffffffffffffffff) {
    memset(&path_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&path_local.Length);
    return stack0xffffffffffffffe8;
  }
  sVar2 = StringRef::size((StringRef *)local_40);
  if (sVar2 == 1) {
    local_68 = (char *)local_40;
    local_60 = fname.Data;
    StringRef::StringRef(&local_78,".");
    LHS_00.Length = (size_t)local_60;
    LHS_00.Data = local_68;
    bVar1 = llvm::operator==(LHS_00,local_78);
    if (!bVar1) goto LAB_0288b564;
LAB_0288b5b7:
    memset(&path_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&path_local.Length);
  }
  else {
LAB_0288b564:
    sVar2 = StringRef::size((StringRef *)local_40);
    if (sVar2 == 2) {
      local_88 = (char *)local_40;
      local_80 = fname.Data;
      StringRef::StringRef(&local_98,"..");
      LHS.Length = (size_t)local_80;
      LHS.Data = local_88;
      bVar1 = llvm::operator==(LHS,local_98);
      if (bVar1) goto LAB_0288b5b7;
    }
    join_0x00000010_0x00000000_ =
         StringRef::substr((StringRef *)local_40,local_58,0xffffffffffffffff);
  }
  return stack0xffffffffffffffe8;
}

Assistant:

StringRef extension(StringRef path, Style style) {
  StringRef fname = filename(path, style);
  size_t pos = fname.find_last_of('.');
  if (pos == StringRef::npos)
    return StringRef();
  else
    if ((fname.size() == 1 && fname == ".") ||
        (fname.size() == 2 && fname == ".."))
      return StringRef();
    else
      return fname.substr(pos);
}